

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

QList<QTableWidgetItem_*> * __thiscall
QTableWidget::findItems
          (QList<QTableWidgetItem_*> *__return_storage_ptr__,QTableWidget *this,QString *text,
          MatchFlags flags)

{
  QTableWidgetPrivate *this_00;
  QAbstractItemModel *pQVar1;
  qsizetype qVar2;
  int iVar3;
  QAbstractItemModel *pQVar4;
  QTableModel *this_01;
  QTableWidgetItem *t;
  ulong uVar5;
  int column;
  int iVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [24];
  QArrayDataPointer<QModelIndex> local_90;
  QArrayDataPointer<QModelIndex> local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableWidgetPrivate **)
             &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
              super_QFrame.super_QWidget.field_0x8;
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QModelIndex *)0x0;
  iVar6 = 0;
  while( true ) {
    iVar3 = columnCount(this);
    qVar2 = local_78.size;
    if (iVar3 <= iVar6) break;
    pQVar1 = (this_00->super_QTableViewPrivate).super_QAbstractItemViewPrivate.model;
    pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
    local_c0 = 0xffffffffffffffff;
    local_b8 = 0;
    uStack_b0 = 0;
    (**(code **)(*(long *)pQVar4 + 0x60))(local_a8,pQVar4,0,iVar6,&local_c0);
    ::QVariant::QVariant(&local_58,(QString *)text);
    (**(code **)(*(long *)pQVar1 + 0x150))
              (&local_90,pQVar1,local_a8,0,&local_58,0xffffffffffffffff,
               flags.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.super_QFlagsStorage<Qt::MatchFlag>.
               i);
    QList<QModelIndex>::append((QList<QModelIndex> *)&local_78,(QList<QModelIndex> *)&local_90);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_90);
    ::QVariant::~QVariant(&local_58);
    iVar6 = iVar6 + 1;
  }
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QTableWidgetItem **)0x0;
  iVar6 = (int)local_78.size;
  QList<QTableWidgetItem_*>::reserve(__return_storage_ptr__,(long)iVar6);
  uVar7 = 0;
  uVar5 = qVar2 & 0xffffffff;
  if (iVar6 < 1) {
    uVar5 = uVar7;
  }
  for (; uVar5 * 0x18 - uVar7 != 0; uVar7 = uVar7 + 0x18) {
    this_01 = QTableWidgetPrivate::tableModel(this_00);
    t = QTableModel::item(this_01,(QModelIndex *)((long)&(local_78.ptr)->r + uVar7));
    QList<QTableWidgetItem_*>::append(__return_storage_ptr__,t);
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTableWidgetItem*> QTableWidget::findItems(const QString &text, Qt::MatchFlags flags) const
{
    Q_D(const QTableWidget);
    QModelIndexList indexes;
    for (int column = 0; column < columnCount(); ++column)
        indexes += d->model->match(model()->index(0, column, QModelIndex()),
                                     Qt::DisplayRole, text, -1, flags);
    QList<QTableWidgetItem*> items;
    const int indexCount = indexes.size();
    items.reserve(indexCount);
    for (int i = 0; i < indexCount; ++i)
        items.append(d->tableModel()->item(indexes.at(i)));
    return items;
}